

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall kj::HttpHeaders::takeOwnership(HttpHeaders *this,HttpHeaders *otherHeaders)

{
  Array<char> *pAVar1;
  RemoveConst<kj::Array<char>_> *pRVar2;
  RemoveConst<kj::Array<char>_> *pRVar3;
  size_t newSize;
  Array<char> *pAVar4;
  
  pAVar4 = (otherHeaders->ownedStrings).builder.ptr;
  pAVar1 = (otherHeaders->ownedStrings).builder.pos;
  if (pAVar4 != pAVar1) {
    pRVar3 = (this->ownedStrings).builder.pos;
    do {
      if (pRVar3 == (this->ownedStrings).builder.endPtr) {
        pRVar2 = (this->ownedStrings).builder.ptr;
        newSize = ((long)pRVar3 - (long)pRVar2 >> 3) * 0x5555555555555556;
        if (pRVar3 == pRVar2) {
          newSize = 4;
        }
        Vector<kj::Array<char>_>::setCapacity(&this->ownedStrings,newSize);
        pRVar3 = (this->ownedStrings).builder.pos;
      }
      pRVar3->ptr = pAVar4->ptr;
      pRVar3->size_ = pAVar4->size_;
      pRVar3->disposer = pAVar4->disposer;
      pAVar4->ptr = (char *)0x0;
      pAVar4->size_ = 0;
      pRVar3 = (this->ownedStrings).builder.pos + 1;
      (this->ownedStrings).builder.pos = pRVar3;
      pAVar4 = pAVar4 + 1;
    } while (pAVar4 != pAVar1);
  }
  ArrayBuilder<kj::Array<char>_>::clear(&(otherHeaders->ownedStrings).builder);
  return;
}

Assistant:

void HttpHeaders::takeOwnership(HttpHeaders&& otherHeaders) {
  for (auto& str: otherHeaders.ownedStrings) {
    ownedStrings.add(kj::mv(str));
  }
  otherHeaders.ownedStrings.clear();
}